

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioScope.cpp
# Opt level: O1

void __thiscall AudioScope::paintEvent(AudioScope *this,QPaintEvent *evt)

{
  Guarded<VisualizerBuffer> *this_00;
  size_t sVar1;
  int iVar2;
  QMutex *pQVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  QPainter painter;
  float right;
  float left;
  undefined1 local_88 [12];
  float local_7c;
  QMutex *local_78;
  double local_70;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  QFrame::paintEvent((QPaintEvent *)this);
  this_00 = this->mBuffer;
  if (this_00 == (Guarded<VisualizerBuffer> *)0x0) {
    drawSilence(this);
    return;
  }
  pQVar3 = &this_00->mMutex;
  LOCK();
  bVar6 = (this_00->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
  if (bVar6) {
    (this_00->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
  }
  UNLOCK();
  if (!bVar6) {
    QBasicMutex::lockInternal();
  }
  sVar1 = VisualizerBuffer::size(&this_00->mHandle);
  if (sVar1 == 0) {
    drawSilence(this);
  }
  else {
    iVar2 = *(int *)(*(long *)&this->field_0x20 + 0x14);
    iVar4 = *(int *)(*(long *)&this->field_0x20 + 0x1c);
    local_78 = pQVar3;
    QPainter::QPainter((QPainter *)local_88,(QPaintDevice *)&this->field_0x10);
    QPainter::setRenderHint((RenderHint)local_88,true);
    QPainter::setPen((QColor *)local_88);
    iVar4 = iVar4 - iVar2;
    local_68 = (float)(sVar1 & 0xffffffff) / (float)(iVar4 + -1);
    VisualizerBuffer::averageSample(&this_00->mHandle,0.0,local_68,(float *)&local_58,&local_7c);
    if (3 < iVar4 + 1) {
      local_5c = 0.0;
      iVar2 = 2;
      fVar8 = 97.0 - local_7c * 32.0;
      fVar7 = 33.0 - local_58._0_4_ * 32.0;
      do {
        local_70 = (double)CONCAT44(local_70._4_4_,fVar7);
        local_5c = local_5c + local_68;
        VisualizerBuffer::averageSample
                  (&this_00->mHandle,local_5c,local_68,(float *)&local_58,&local_7c);
        local_64 = 33.0 - local_58._0_4_ * 32.0;
        local_60 = local_7c * 32.0;
        local_58 = (double)(iVar2 + -1);
        local_50 = (double)local_70._0_4_;
        local_48 = (double)iVar2;
        local_40 = (double)local_64;
        iVar5 = (int)&local_58;
        local_70 = local_58;
        local_38 = local_48;
        QPainter::drawLines((QLineF *)local_88,iVar5);
        fVar7 = 97.0 - local_60;
        local_50 = (double)fVar8;
        local_40 = (double)fVar7;
        local_58 = local_70;
        local_48 = local_38;
        QPainter::drawLines((QLineF *)local_88,iVar5);
        iVar2 = iVar2 + 1;
        fVar8 = fVar7;
        fVar7 = local_64;
      } while (iVar4 != iVar2);
    }
    QPainter::~QPainter((QPainter *)local_88);
    pQVar3 = local_78;
  }
  LOCK();
  bVar6 = (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
  if (bVar6) {
    (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  }
  UNLOCK();
  if (!bVar6) {
    QBasicMutex::unlockInternal();
  }
  return;
}

Assistant:

void AudioScope::paintEvent(QPaintEvent *evt) {
    QFrame::paintEvent(evt);

    // it may be more efficient to do renderering in a separate thread
    // we can convert a sample buffer to a buffer of QLines, then
    // the paint event just draws the lines

    if (mBuffer == nullptr) {
        // no buffer, draw nothing
        drawSilence();
        return;
    }

    auto handle = mBuffer->access();
    auto size = handle->size();
    if (size == 0) {
        // buffer is empty, draw nothing
        drawSilence();
        return;
    }

    auto const w = width() - (TU::LINE_WIDTH * 2);
    
    QPainter painter(this);
    painter.setRenderHint(QPainter::Antialiasing);
    painter.setPen(mLineColor);

    // pixels per sample
    float ratio = (unsigned)size / (float)w;
    float index = 0;

    float prevLeft;
    float prevRight;
    sample(handle, 0.0f, ratio, prevLeft, prevRight);

    int const end = w + TU::LINE_WIDTH;
    for (int t = 1 + TU::LINE_WIDTH; t < end; ++t) {
        index += ratio;
        
        float leftSample;
        float rightSample;
        sample(handle, index, ratio, leftSample, rightSample);

        painter.drawLine(QLineF(t - 1, prevLeft, t, leftSample));
        painter.drawLine(QLineF(t - 1, prevRight, t, rightSample));

        prevLeft = leftSample;
        prevRight = rightSample;

        
    }
    
}